

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::mark_dual_layers(Omega_h *this,Mesh *mesh,Read<signed_char> *marks,Int nlayers)

{
  Omega_h_Parting OVar1;
  uint uVar2;
  void *extraout_RDX;
  Read<signed_char> RVar3;
  Read<signed_char> local_c0;
  undefined1 local_b0 [80];
  Read<signed_char> local_60;
  int local_4c;
  undefined1 local_48 [4];
  Int i;
  Graph dual;
  Int nlayers_local;
  Read<signed_char> *marks_local;
  Mesh *mesh_local;
  
  dual.ab2b.write_.shared_alloc_.direct_ptr._4_4_ = nlayers;
  OVar1 = Mesh::parting(mesh);
  if (OVar1 == OMEGA_H_GHOSTED) {
    Mesh::ask_dual((Graph *)local_48,mesh);
    for (local_4c = 0; local_4c < dual.ab2b.write_.shared_alloc_.direct_ptr._4_4_;
        local_4c = local_4c + 1) {
      Graph::Graph((Graph *)(local_b0 + 0x30),(Graph *)local_48);
      Read<signed_char>::Read((Read<signed_char> *)(local_b0 + 0x10),marks);
      graph_reduce<signed_char>
                ((Omega_h *)&local_60,(Graph *)(local_b0 + 0x30),
                 (Read<signed_char> *)(local_b0 + 0x10),1,OMEGA_H_MAX);
      Read<signed_char>::operator=(marks,&local_60);
      Read<signed_char>::~Read(&local_60);
      Read<signed_char>::~Read((Read<signed_char> *)(local_b0 + 0x10));
      Graph::~Graph((Graph *)(local_b0 + 0x30));
      uVar2 = Mesh::dim(mesh);
      Read<signed_char>::Read(&local_c0,marks);
      Mesh::sync_array<signed_char>
                ((Mesh *)local_b0,(Int)mesh,(Read<signed_char> *)(ulong)uVar2,(Int)&local_c0);
      Read<signed_char>::operator=(marks,(Read<signed_char> *)local_b0);
      Read<signed_char>::~Read((Read<signed_char> *)local_b0);
      Read<signed_char>::~Read(&local_c0);
    }
    Read<signed_char>::Read((Read<signed_char> *)this,marks);
    Graph::~Graph((Graph *)local_48);
    RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar3.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,0xbf);
}

Assistant:

Read<I8> mark_dual_layers(Mesh* mesh, Read<I8> marks, Int nlayers) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto dual = mesh->ask_dual();
  for (Int i = 0; i < nlayers; ++i) {
    marks = graph_reduce(dual, marks, 1, OMEGA_H_MAX);
    marks = mesh->sync_array(mesh->dim(), marks, 1);
  }
  return marks;
}